

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseMumpsCoverage.cxx
# Opt level: O1

void __thiscall cmParseMumpsCoverage::InitializeMumpsFile(cmParseMumpsCoverage *this,string *file)

{
  char cVar1;
  iterator iVar2;
  bool bVar3;
  vector<int,std::allocator<int>> *this_00;
  ulong uVar4;
  ulong uVar5;
  int val;
  string line;
  ifstream in;
  int local_25c;
  string local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(file->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    local_258._M_string_length = 0;
    local_258.field_2._M_local_buf[0] = '\0';
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    this_00 = (vector<int,std::allocator<int>> *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&this->Coverage->TotalCoverage,file);
    bVar3 = cmsys::SystemTools::GetLineFromStream
                      ((istream *)local_238,&local_258,(bool *)0x0,0xffffffffffffffff);
    if (bVar3) {
      local_25c = -1;
      iVar2._M_current = *(int **)(this_00 + 8);
      if (iVar2._M_current == *(int **)(this_00 + 0x10)) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)this_00,iVar2,&local_25c);
      }
      else {
        *iVar2._M_current = -1;
        *(int **)(this_00 + 8) = iVar2._M_current + 1;
      }
LAB_001bbc19:
      bVar3 = cmsys::SystemTools::GetLineFromStream
                        ((istream *)local_238,&local_258,(bool *)0x0,0xffffffffffffffff);
      if (bVar3) {
        local_25c = -1;
        if (local_258._M_string_length != 0) {
          uVar4 = 0;
          do {
            cVar1 = local_258._M_dataplus._M_p[uVar4];
            uVar5 = uVar4;
            if (cVar1 == '\t') {
LAB_001bbc6b:
              if (local_258._M_string_length <= uVar4) goto LAB_001bbc8b;
              goto LAB_001bbc70;
            }
            if (cVar1 == ';') goto LAB_001bbc8b;
            if (cVar1 == ' ') goto LAB_001bbc6b;
            uVar4 = uVar4 + 1;
          } while (local_258._M_string_length != uVar4);
        }
        goto LAB_001bbc9e;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                               local_258.field_2._M_local_buf[0]) + 1);
    }
  }
  std::ifstream::~ifstream(local_238);
  return;
  while (uVar4 = uVar4 + 1, uVar5 = local_258._M_string_length, uVar4 < local_258._M_string_length)
  {
LAB_001bbc70:
    uVar5 = uVar4;
    if ((0x2e < (ulong)(byte)local_258._M_dataplus._M_p[uVar4]) ||
       ((0x400100000200U >> ((ulong)(byte)local_258._M_dataplus._M_p[uVar4] & 0x3f) & 1) == 0))
    break;
  }
LAB_001bbc8b:
  if ((uVar5 < local_258._M_string_length) && (local_258._M_dataplus._M_p[uVar5] != ';')) {
    local_25c = 0;
  }
LAB_001bbc9e:
  iVar2._M_current = *(int **)(this_00 + 8);
  if (iVar2._M_current == *(int **)(this_00 + 0x10)) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(this_00,iVar2,&local_25c);
  }
  else {
    *iVar2._M_current = local_25c;
    *(int **)(this_00 + 8) = iVar2._M_current + 1;
  }
  goto LAB_001bbc19;
}

Assistant:

void cmParseMumpsCoverage::InitializeMumpsFile(std::string& file)
{
  // initialize the coverage information for a given mumps file
  cmsys::ifstream in(file.c_str());
  if (!in) {
    return;
  }
  std::string line;
  cmCTestCoverageHandlerContainer::SingleFileCoverageVector& coverageVector =
    this->Coverage.TotalCoverage[file];
  if (!cmSystemTools::GetLineFromStream(in, line)) {
    return;
  }
  // first line of a .m file can never be run
  coverageVector.push_back(-1);
  while (cmSystemTools::GetLineFromStream(in, line)) {
    // putting in a 0 for a line means it is executable code
    // putting in a -1 for a line means it is not executable code
    int val = -1; // assume line is not executable
    bool found = false;
    std::string::size_type i = 0;
    // (1) Search for the first whitespace or semicolon character on a line.
    // This will skip over labels if the line starts with one, or will simply
    // be the first character on the line for non-label lines.
    for (; i < line.size(); ++i) {
      if (line[i] == ' ' || line[i] == '\t' || line[i] == ';') {
        found = true;
        break;
      }
    }
    if (found) {
      // (2) If the first character found above is whitespace or a period
      // then continue the search for the first following non-whitespace
      // character.
      if (line[i] == ' ' || line[i] == '\t') {
        while (i < line.size() &&
               (line[i] == ' ' || line[i] == '\t' || line[i] == '.')) {
          i++;
        }
      }
      // (3) If the character found is not a semicolon then the line counts for
      // coverage.
      if (i < line.size() && line[i] != ';') {
        val = 0;
      }
    }
    coverageVector.push_back(val);
  }
}